

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O3

void Abc_NtkCecFraigPartAuto(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nSeconds,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  void *__ptr;
  int iVar5;
  Abc_Ntk_t *pMiter;
  int *pModel;
  Abc_Frame_t *pAVar6;
  Vec_Ptr_t *__ptr_00;
  Vec_Ptr_t *vOutsPtr;
  void **ppvVar7;
  Abc_Ntk_t *pNtk;
  long lVar8;
  char *__s;
  Abc_Ntk_t *pMiterPart;
  Prove_Params_t Params;
  Prove_Params_t local_88;
  
  Prove_ParamsSetDefault(&local_88);
  local_88.nItersMax = 5;
  pMiter = Abc_NtkMiter(pNtk1,pNtk2,1,1,0,0);
  if (pMiter == (Abc_Ntk_t *)0x0) {
    puts("Miter computation has failed.");
    return;
  }
  iVar5 = Abc_NtkMiterIsConstant(pMiter);
  if (iVar5 == 1) {
    __s = "Networks are equivalent after structural hashing.";
  }
  else {
    if (iVar5 == 0) {
      puts("Networks are NOT EQUIVALENT after structural hashing.");
      pModel = (int *)calloc(1,(long)pMiter->vCis->nSize << 2);
      pMiter->pModel = pModel;
      Abc_NtkVerifyReportError(pNtk1,pNtk2,pModel);
      if (pMiter->pModel != (int *)0x0) {
        free(pMiter->pModel);
        pMiter->pModel = (int *)0x0;
      }
      goto LAB_002b89c6;
    }
    pAVar6 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar6,"unset progressbar");
    __ptr_00 = Abc_NtkPartitionSmart(pMiter,300,0);
    vOutsPtr = (Vec_Ptr_t *)malloc(0x10);
    vOutsPtr->nCap = 1000;
    vOutsPtr->nSize = 0;
    ppvVar7 = (void **)malloc(8000);
    vOutsPtr->pArray = ppvVar7;
    if (0 < __ptr_00->nSize) {
      lVar8 = 0;
      do {
        Abc_NtkConvertCos(pMiter,(Vec_Int_t *)__ptr_00->pArray[lVar8],vOutsPtr);
        pNtk = Abc_NtkCreateConeArray(pMiter,vOutsPtr,0);
        Abc_NtkCombinePos(pNtk,0,0);
        iVar5 = Abc_NtkMiterIsConstant(pNtk);
        if (iVar5 != 1) {
          if (iVar5 != 0) {
            uVar1 = __ptr_00->nSize;
            uVar2 = pNtk->vPis->nSize;
            uVar3 = pNtk->vPos->nSize;
            uVar4 = pNtk->nObjCounts[7];
            iVar5 = Abc_AigLevel(pNtk);
            printf("Verifying part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r",
                   lVar8 + 1U & 0xffffffff,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,iVar5
                  );
            fflush(_stdout);
          }
          puts("Networks are NOT EQUIVALENT after partitioning.");
          Abc_NtkDelete(pNtk);
          break;
        }
        Abc_NtkDelete(pNtk);
        lVar8 = lVar8 + 1;
      } while (lVar8 < __ptr_00->nSize);
    }
    printf(
          "                                                                                          \r"
          );
    iVar5 = __ptr_00->nSize;
    if (0 < iVar5) {
      lVar8 = 0;
      do {
        __ptr = __ptr_00->pArray[lVar8];
        if (__ptr != (void *)0x0) {
          if (*(void **)((long)__ptr + 8) != (void *)0x0) {
            free(*(void **)((long)__ptr + 8));
          }
          free(__ptr);
          iVar5 = __ptr_00->nSize;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < iVar5);
    }
    if (__ptr_00->pArray != (void **)0x0) {
      free(__ptr_00->pArray);
    }
    free(__ptr_00);
    if (vOutsPtr->pArray != (void **)0x0) {
      free(vOutsPtr->pArray);
    }
    free(vOutsPtr);
    pAVar6 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar6,"set progressbar");
    __s = "Networks are equivalent.                         ";
  }
  puts(__s);
LAB_002b89c6:
  Abc_NtkDelete(pMiter);
  return;
}

Assistant:

void Abc_NtkCecFraigPartAuto( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nSeconds, int fVerbose )
{
    extern Vec_Ptr_t * Abc_NtkPartitionSmart( Abc_Ntk_t * pNtk, int nPartSizeLimit, int fVerbose );
    extern void Abc_NtkConvertCos( Abc_Ntk_t * pNtk, Vec_Int_t * vOuts, Vec_Ptr_t * vOnePtr );

    Vec_Ptr_t * vParts, * vOnePtr;
    Vec_Int_t * vOne;
    Prove_Params_t Params, * pParams = &Params;
    Abc_Ntk_t * pMiter, * pMiterPart;
    int i, RetValue, Status, nOutputs;

    // solve the CNF using the SAT solver
    Prove_ParamsSetDefault( pParams );
    pParams->nItersMax = 5;
    //    pParams->fVerbose = 1;

    // get the miter of the two networks
    pMiter = Abc_NtkMiter( pNtk1, pNtk2, 1, 1, 0, 0 );
    if ( pMiter == NULL )
    {
        printf( "Miter computation has failed.\n" );
        return;
    }
    RetValue = Abc_NtkMiterIsConstant( pMiter );
    if ( RetValue == 0 )
    {
        printf( "Networks are NOT EQUIVALENT after structural hashing.\n" );
        // report the error
        pMiter->pModel = Abc_NtkVerifyGetCleanModel( pMiter, 1 );
        Abc_NtkVerifyReportError( pNtk1, pNtk2, pMiter->pModel );
        ABC_FREE( pMiter->pModel );
        Abc_NtkDelete( pMiter );
        return;
    }
    if ( RetValue == 1 )
    {
        printf( "Networks are equivalent after structural hashing.\n" );
        Abc_NtkDelete( pMiter );
        return;
    }

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "unset progressbar" );

    // partition the outputs
    vParts = Abc_NtkPartitionSmart( pMiter, 300, 0 );

    // fraig each partition
    Status = 1;
    nOutputs = 0;
    vOnePtr = Vec_PtrAlloc( 1000 );
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vOne, i )
    {
        // get this part of the miter
        Abc_NtkConvertCos( pMiter, vOne, vOnePtr );
        pMiterPart = Abc_NtkCreateConeArray( pMiter, vOnePtr, 0 );
        Abc_NtkCombinePos( pMiterPart, 0, 0 );
        // check the miter for being constant
        RetValue = Abc_NtkMiterIsConstant( pMiterPart );
        if ( RetValue == 0 )
        {
            printf( "Networks are NOT EQUIVALENT after partitioning.\n" );
            Abc_NtkDelete( pMiterPart );
            break;
        }
        if ( RetValue == 1 )
        {
            Abc_NtkDelete( pMiterPart );
            continue;
        }
        printf( "Verifying part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r", 
            i+1, Vec_PtrSize(vParts), Abc_NtkPiNum(pMiterPart), Abc_NtkPoNum(pMiterPart), 
            Abc_NtkNodeNum(pMiterPart), Abc_AigLevel(pMiterPart) );
        fflush( stdout );
        // solve the problem
        RetValue = Abc_NtkIvyProve( &pMiterPart, pParams );
        if ( RetValue == -1 )
        {
            printf( "Networks are undecided (resource limits is reached).\r" );
            Status = -1;
        }
        else if ( RetValue == 0 )
        {
            int * pSimInfo = Abc_NtkVerifySimulatePattern( pMiterPart, pMiterPart->pModel );
            if ( pSimInfo[0] != 1 )
                printf( "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n" );
            else
                printf( "Networks are NOT EQUIVALENT.                 \n" );
            ABC_FREE( pSimInfo );
            Status = 0;
            Abc_NtkDelete( pMiterPart );
            break;
        }
        else
        {
//            printf( "Finished part %5d (out of %5d)\r", i+1, Vec_PtrSize(vParts) );
            nOutputs += Vec_IntSize(vOne);
        }
        Abc_NtkDelete( pMiterPart );
    }
    printf( "                                                                                          \r" );
    Vec_VecFree( (Vec_Vec_t *)vParts );
    Vec_PtrFree( vOnePtr );

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "set progressbar" );

    if ( Status == 1 )
        printf( "Networks are equivalent.                         \n" );
    else if ( Status == -1 )
        printf( "Timed out after verifying %d outputs (out of %d).\n", nOutputs, Abc_NtkCoNum(pNtk1) );
    Abc_NtkDelete( pMiter );
}